

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O3

bool __thiscall ELFIO::elfio::load(elfio *this,istream *stream)

{
  bool bVar1;
  int iVar2;
  elf_header *peVar3;
  uchar e_ident [16];
  int local_28;
  uchar uStack_24;
  uchar uStack_23;
  
  clean(this);
  std::istream::read((char *)stream,(long)&local_28);
  if (((*(long *)(stream + 8) == 0x10) && (local_28 == 0x464c457f)) &&
     (0xfd < (byte)(uStack_24 - 3))) {
    (this->convertor).need_conversion = uStack_23 != '\x01';
    peVar3 = create_header(this,uStack_24,uStack_23);
    this->header = peVar3;
    if ((peVar3 != (elf_header *)0x0) &&
       (iVar2 = (*peVar3->_vptr_elf_header[2])(peVar3,stream), (char)iVar2 != '\0')) {
      load_sections(this,stream);
      bVar1 = load_segments(this,stream);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool load( std::istream &stream )
    {
        clean();

	unsigned char e_ident[EI_NIDENT];
	// Read ELF file signature
	stream.read( reinterpret_cast<char*>( &e_ident ), sizeof( e_ident ) );

        // Is it ELF file?
        if ( stream.gcount() != sizeof( e_ident ) ||
             e_ident[EI_MAG0] != ELFMAG0    ||
             e_ident[EI_MAG1] != ELFMAG1    ||
             e_ident[EI_MAG2] != ELFMAG2    ||
             e_ident[EI_MAG3] != ELFMAG3 ) {
            return false;
        }

        if ( ( e_ident[EI_CLASS] != ELFCLASS64 ) &&
             ( e_ident[EI_CLASS] != ELFCLASS32 )) {
            return false;
        }

        convertor.setup( e_ident[EI_DATA] );
        header = create_header( e_ident[EI_CLASS], e_ident[EI_DATA] );
        if ( 0 == header ) {
            return false;
        }
        if ( !header->load( stream ) ) {
            return false;
        }

        load_sections( stream );
        bool is_still_good = load_segments( stream );
        return is_still_good;
    }